

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

UString * jsonnet::internal::jsonnet_string_escape(UString *str,bool single)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  undefined8 uVar5;
  byte in_DL;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RSI;
  UString *in_RDI;
  stringstream ss8;
  char32_t c;
  size_t i;
  UStringStream ss;
  UString *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  _Setw in_stack_fffffffffffffd94;
  UString *s;
  string local_228 [64];
  int local_1e8;
  char local_1e1;
  stringstream local_1e0 [16];
  ostream local_1d0 [396];
  value_type local_44;
  ulong local_40;
  byte local_11;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_10;
  
  local_11 = in_DL & 1;
  s = in_RDI;
  local_10 = in_RSI;
  UStringStream::UStringStream((UStringStream *)0x28104c);
  for (local_40 = 0; uVar1 = local_40,
      sVar2 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                        (local_10), uVar1 < sVar2; local_40 = local_40 + 1) {
    pvVar3 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
             operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90),
                        (size_type)in_stack_fffffffffffffd88);
    local_44 = *pvVar3;
    if (local_44 == L'\0') {
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,(char32_t *)in_stack_fffffffffffffd88);
    }
    else if (local_44 == L'\b') {
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,(char32_t *)in_stack_fffffffffffffd88);
    }
    else if (local_44 == L'\t') {
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,(char32_t *)in_stack_fffffffffffffd88);
    }
    else if (local_44 == L'\n') {
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,(char32_t *)in_stack_fffffffffffffd88);
    }
    else if (local_44 == L'\f') {
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,(char32_t *)in_stack_fffffffffffffd88);
    }
    else if (local_44 == L'\r') {
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,(char32_t *)in_stack_fffffffffffffd88);
    }
    else if (local_44 == L'\"') {
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,(char32_t *)in_stack_fffffffffffffd88);
    }
    else if (local_44 == L'\'') {
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,(char32_t *)in_stack_fffffffffffffd88);
    }
    else if (local_44 == L'\\') {
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,(char32_t *)in_stack_fffffffffffffd88);
    }
    else if (((uint)local_44 < 0x20) || ((0x7e < (uint)local_44 && ((uint)local_44 < 0xa0)))) {
      std::__cxx11::stringstream::stringstream(local_1e0);
      poVar4 = std::operator<<(local_1d0,"\\u");
      uVar5 = std::ostream::operator<<(poVar4,std::hex);
      local_1e1 = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(uVar5,local_1e1);
      in_stack_fffffffffffffd94 = std::setw(4);
      local_1e8 = in_stack_fffffffffffffd94._M_n;
      in_stack_fffffffffffffd88 = (UString *)std::operator<<(poVar4,in_stack_fffffffffffffd94);
      std::ostream::operator<<(in_stack_fffffffffffffd88,(ulong)(uint)local_44);
      std::__cxx11::stringstream::str();
      decode_utf8((string *)s);
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,in_stack_fffffffffffffd88);
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90));
      std::__cxx11::string::~string(local_228);
      std::__cxx11::stringstream::~stringstream(local_1e0);
    }
    else {
      UStringStream::operator<<
                ((UStringStream *)CONCAT44(in_stack_fffffffffffffd94._M_n,in_stack_fffffffffffffd90)
                 ,(char32_t)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    }
  }
  UStringStream::str_abi_cxx11_((UStringStream *)in_stack_fffffffffffffd88);
  UStringStream::~UStringStream((UStringStream *)0x281455);
  return in_RDI;
}

Assistant:

UString jsonnet_string_escape(const UString &str, bool single)
{
    UStringStream ss;
    for (std::size_t i = 0; i < str.length(); ++i) {
        char32_t c = str[i];
        switch (c) {
            case U'\"': ss << (single ? U"\"" : U"\\\""); break;
            case U'\'': ss << (single ? U"\\\'" : U"\'"); break;
            case U'\\': ss << U"\\\\"; break;
            case U'\b': ss << U"\\b"; break;
            case U'\f': ss << U"\\f"; break;
            case U'\n': ss << U"\\n"; break;
            case U'\r': ss << U"\\r"; break;
            case U'\t': ss << U"\\t"; break;
            case U'\0': ss << U"\\u0000"; break;
            default: {
                if (c < 0x20 || (c >= 0x7f && c <= 0x9f)) {
                    // Unprintable, use \u
                    std::stringstream ss8;
                    ss8 << "\\u" << std::hex << std::setfill('0') << std::setw(4)
                        << (unsigned long)(c);
                    ss << decode_utf8(ss8.str());
                } else {
                    // Printable, write verbatim
                    ss << c;
                }
            }
        }
    }
    return ss.str();
}